

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psstack.c
# Opt level: O0

CF2_Stack cf2_stack_init(FT_Memory memory,FT_Error *e,FT_UInt stackSize)

{
  FT_Free_Func p_Var1;
  CF2_Stack stack;
  FT_Error error;
  FT_UInt stackSize_local;
  FT_Error *e_local;
  FT_Memory memory_local;
  
  stack._4_4_ = stackSize;
  _error = (FT_Alloc_Func)e;
  e_local = (FT_Error *)memory;
  memory_local = (FT_Memory)ft_mem_qalloc(memory,0x28,(FT_Error *)&stack);
  if ((int)stack == 0) {
    memory_local->user = e_local;
    memory_local->alloc = _error;
    p_Var1 = (FT_Free_Func)
             ft_mem_qrealloc((FT_Memory)e_local,8,0,(ulong)stack._4_4_,(void *)0x0,
                             (FT_Error *)&stack);
    memory_local->free = p_Var1;
    if ((int)stack == 0) {
      *(FT_UInt *)&memory_local[1].user = stack._4_4_;
      memory_local->realloc = (FT_Realloc_Func)memory_local->free;
    }
    else {
      ft_mem_free((FT_Memory)e_local,memory_local);
      memory_local = (FT_Memory)0x0;
    }
  }
  else {
    memory_local = (FT_Memory)0x0;
  }
  return (CF2_Stack)memory_local;
}

Assistant:

FT_LOCAL_DEF( CF2_Stack )
  cf2_stack_init( FT_Memory  memory,
                  FT_Error*  e,
                  FT_UInt    stackSize )
  {
    FT_Error   error;        /* for FT_QNEW */
    CF2_Stack  stack = NULL;


    if ( FT_QNEW( stack ) )
      return NULL;

    stack->memory = memory;
    stack->error  = e;

    /* allocate the stack buffer */
    if ( FT_QNEW_ARRAY( stack->buffer, stackSize ) )
    {
      FT_FREE( stack );
      return NULL;
    }

    stack->stackSize = stackSize;
    stack->top       = stack->buffer;     /* empty stack */

    return stack;
  }